

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O3

void __thiscall
helics::FederateInfo::loadInfoFromArgs
          (FederateInfo *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ParseOutput PVar1;
  HelicsException *this_00;
  string_view message;
  helicsCLI11App *local_20;
  
  makeCLIApp((FederateInfo *)&stack0xffffffffffffffe0);
  (local_20->super_App).allow_extras_ = true;
  PVar1 = helicsCLI11App::
          helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                    (local_20,args);
  if (PVar1 != PARSE_ERROR) {
    config_additional(this,&local_20->super_App);
    if (local_20 != (helicsCLI11App *)0x0) {
      (*(local_20->super_App)._vptr_App[1])();
    }
    return;
  }
  this_00 = (HelicsException *)__cxa_allocate_exception(0x28);
  message._M_str = "argument parsing failed";
  message._M_len = 0x17;
  HelicsException::HelicsException(this_00,message);
  *(undefined ***)this_00 = &PTR__HelicsException_0054b1d8;
  __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void FederateInfo::loadInfoFromArgs(std::vector<std::string>& args)
{
    auto app = makeCLIApp();
    app->allow_extras();
    auto ret = app->helics_parse(args);
    if (ret == helicsCLI11App::ParseOutput::PARSE_ERROR) {
        throw helics::InvalidParameter("argument parsing failed");
    }
    config_additional(app.get());
}